

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

char16_t *
(anonymous_namespace)::UnrollTailLoop<1u>::
exec<char16_t_const*,QtPrivate::qustrchr(QStringView,char16_t)::__1,QtPrivate::qustrchr(QStringView,char16_t)::__2,long>
          (long count,char16_t *returnIfExited,anon_class_16_2_94731f9e loopCheck,
          anon_class_8_1_54a3980e returnIfFailed,long i)

{
  anon_class_16_2_94731f9e aVar1;
  bool bVar2;
  char16_t *in_RDX;
  char16_t *in_RSI;
  anon_class_8_1_54a3980e in_RDI;
  char16_t *in_R8;
  char16_t *in_R9;
  long in_FS_OFFSET;
  bool check;
  undefined7 in_stack_ffffffffffffffa0;
  char16_t *in_stack_ffffffffffffffc0;
  anon_class_8_1_54a3980e local_30;
  char16_t *local_28;
  anon_class_16_2_94731f9e local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI.n != (char16_t *)0x0) {
    local_30.n = in_R8;
    local_18.n = in_RDX;
    bVar2 = QtPrivate::qustrchr::anon_class_16_2_94731f9e::operator()(&local_18,(qsizetype)in_R9);
    if (bVar2) {
      in_RSI = QtPrivate::qustrchr::anon_class_8_1_54a3980e::operator()(&local_30,(qsizetype)in_R9);
    }
    else {
      local_28 = local_18.n;
      aVar1._8_8_ = local_30.n;
      aVar1.n = in_stack_ffffffffffffffc0;
      in_RSI = UnrollTailLoop<0u>::
               exec<char16_t_const*,QtPrivate::qustrchr(QStringView,char16_t)::__1,QtPrivate::qustrchr(QStringView,char16_t)::__2,long>
                         ((long)in_RSI,in_R9,aVar1,in_RDI,CONCAT17(bVar2,in_stack_ffffffffffffffa0))
      ;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RSI;
}

Assistant:

static inline RetType exec(Number count, RetType returnIfExited, Functor1 loopCheck, Functor2 returnIfFailed, Number i = 0)
    {
        /* equivalent to:
         *   while (count--) {
         *       if (loopCheck(i))
         *           return returnIfFailed(i);
         *   }
         *   return returnIfExited;
         */

        if (!count)
            return returnIfExited;

        bool check = loopCheck(i);
        if (check)
            return returnIfFailed(i);

        return UnrollTailLoop<MaxCount - 1>::exec(count - 1, returnIfExited, loopCheck, returnIfFailed, i + 1);
    }